

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlerror(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int n_ctx;
  uint uVar11;
  ulong uVar12;
  int test_ret;
  uint local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlerror : 7 of 18 functions ...");
  }
  iVar1 = xmlMemBlocks();
  initGenericErrorDefaultFunc(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in initGenericErrorDefaultFunc",(ulong)(uint)(iVar3 - iVar1));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlCopyError(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCopyError",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    xmlCtxtResetLastError(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtResetLastError",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",uVar12);
      putchar(10);
    }
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 == 1);
  local_34 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlParserPrintFileContext(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserPrintFileContext",(ulong)(uint)(iVar6 - iVar1));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlParserPrintFileInfo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserPrintFileInfo",(ulong)(uint)(iVar8 - iVar6));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlResetError(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlResetError",(ulong)(uint)(iVar10 - iVar8));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  xmlResetLastError();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  uVar11 = (iVar3 != iVar4) + local_34 + iVar5 + (uint)(iVar1 != iVar2) + (uint)(iVar6 != iVar7) +
           (uint)(iVar8 != iVar9);
  if (uVar11 != 0) {
    printf("Module xmlerror: %d errors\n",(ulong)uVar11);
  }
  return uVar11;
}

Assistant:

static int
test_xmlerror(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlerror : 7 of 18 functions ...\n");
    test_ret += test_initGenericErrorDefaultFunc();
    test_ret += test_xmlCopyError();
    test_ret += test_xmlCtxtGetLastError();
    test_ret += test_xmlCtxtResetLastError();
    test_ret += test_xmlFormatError();
    test_ret += test_xmlGetLastError();
    test_ret += test_xmlParserError();
    test_ret += test_xmlParserPrintFileContext();
    test_ret += test_xmlParserPrintFileInfo();
    test_ret += test_xmlParserValidityError();
    test_ret += test_xmlParserValidityWarning();
    test_ret += test_xmlParserWarning();
    test_ret += test_xmlResetError();
    test_ret += test_xmlResetLastError();
    test_ret += test_xmlSetGenericErrorFunc();
    test_ret += test_xmlSetStructuredErrorFunc();
    test_ret += test_xmlThrDefSetGenericErrorFunc();
    test_ret += test_xmlThrDefSetStructuredErrorFunc();

    if (test_ret != 0)
	printf("Module xmlerror: %d errors\n", test_ret);
    return(test_ret);
}